

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O0

Response * webfront::http::Response::getStatusResponse(StatusCode code)

{
  StatusCode in_SI;
  Response *in_RDI;
  Response *response;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  Response *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Response *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  undefined6 in_stack_fffffffffffffec8;
  StatusCode in_stack_fffffffffffffece;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  undefined1 local_b;
  StatusCode local_a;
  
  local_b = 0;
  this = in_RDI;
  local_a = in_SI;
  Response(in_stack_fffffffffffffe80);
  in_RDI->statusCode = local_a;
  toString_abi_cxx11_(in_stack_fffffffffffffece);
  ::std::operator+((char *)in_stack_fffffffffffffe88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe80);
  ::std::operator+(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
  __lhs = &local_30;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffed0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT26(in_stack_fffffffffffffece,in_stack_fffffffffffffec8));
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe80);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe80);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe80);
  std::__cxx11::to_string(in_stack_fffffffffffffebc);
  ::std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe80);
  ::std::operator+(__lhs,(char *)in_stack_fffffffffffffe80);
  toString_abi_cxx11_(in_stack_fffffffffffffece);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   in_stack_fffffffffffffeb0);
  ::std::operator+(__lhs,(char *)in_stack_fffffffffffffe80);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe80);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe80);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe80);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe80);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe80);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe80);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (&in_RDI->content);
  std::__cxx11::to_string(CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  ::std::vector<webfront::http::Headers::Header,std::allocator<webfront::http::Headers::Header>>::
  emplace_back<char_const(&)[15],std::__cxx11::string>
            ((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
              *)this,(char (*) [15])__lhs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  ::std::vector<webfront::http::Headers::Header,std::allocator<webfront::http::Headers::Header>>::
  emplace_back<char_const(&)[13],char_const(&)[10]>
            ((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
              *)this,(char (*) [13])__lhs,(char (*) [10])in_RDI);
  return this;
}

Assistant:

static Response getStatusResponse(StatusCode code) {
        Response response;
        response.statusCode = code;
        response.content = "<html><head><title>" + toString(code) + "</title></head>";
        response.content += "<body><h1>" + std::to_string(code) + " " + toString(code) + "</h1></body></html>";
        response.headers.emplace_back("Content-Length", std::to_string(response.content.size()));
        response.headers.emplace_back("Content-Type", "text/html");

        return response;
    }